

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O0

U32 MEM_swap32(U32 in)

{
  U32 in_local;
  
  return in >> 0x18 | (in & 0xff0000) >> 8 | (in & 0xff00) << 8 | in << 0x18;
}

Assistant:

MEM_STATIC U32 MEM_swap32(U32 in)
{
#if defined(_MSC_VER)     /* Visual Studio */
    return _byteswap_ulong(in);
#elif (defined (__GNUC__) && (__GNUC__ * 100 + __GNUC_MINOR__ >= 403)) \
  || (defined(__clang__) && __has_builtin(__builtin_bswap32))
    return __builtin_bswap32(in);
#else
    return  ((in << 24) & 0xff000000 ) |
            ((in <<  8) & 0x00ff0000 ) |
            ((in >>  8) & 0x0000ff00 ) |
            ((in >> 24) & 0x000000ff );
#endif
}